

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.cpp
# Opt level: O0

step * make_empty_step(uint *wastage,bucket *b)

{
  bucket *in_RDX;
  uint *in_RSI;
  step *in_RDI;
  
  step::step(in_RDI,empty,in_RSI,in_RDX,(bucket *)0x0);
  return in_RDI;
}

Assistant:

step make_empty_step(unsigned& wastage, bucket* b)
{
	return step{action::empty, &wastage, b};
}